

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-try-send.c
# Opt level: O2

int run_test_udp_try_send(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  char *pcVar3;
  char *pcVar4;
  undefined8 uVar5;
  int64_t eval_b;
  int64_t eval_b_6;
  int64_t eval_a;
  size_t local_20;
  sockaddr_in addr;
  
  local_20 = eval_a;
  iVar1 = uv_ip4_addr("0.0.0.0",0x23a3,&addr);
  eval_a = (int64_t)(long)iVar1;
  if ((char *)(long)iVar1 == (char *)0x0) {
    puVar2 = uv_default_loop();
    iVar1 = uv_udp_init(puVar2,&server);
    eval_a = (int64_t)(long)iVar1;
    if ((char *)(long)iVar1 == (char *)0x0) {
      iVar1 = uv_udp_bind(&server,(sockaddr *)&addr,0);
      eval_a = (int64_t)(long)iVar1;
      if ((char *)(long)iVar1 == (char *)0x0) {
        iVar1 = uv_udp_recv_start(&server,alloc_cb,sv_recv_cb);
        eval_a = (int64_t)(long)iVar1;
        if ((char *)(long)iVar1 == (char *)0x0) {
          iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&addr);
          eval_a = (int64_t)(long)iVar1;
          if ((char *)(long)iVar1 == (char *)0x0) {
            puVar2 = uv_default_loop();
            iVar1 = uv_udp_init(puVar2,&client);
            eval_a = (int64_t)(long)iVar1;
            if ((char *)(long)iVar1 == (char *)0x0) {
              _eval_a = uv_buf_init(run_test_udp_try_send::buffer,0x10000);
              iVar1 = uv_udp_try_send(&client,(uv_buf_t *)&eval_a,1,(sockaddr *)&addr);
              eval_b = (int64_t)iVar1;
              eval_b_6 = -0x5a;
              if (eval_b == 0xffffffffffffffa6) {
                _eval_a = uv_buf_init("EXIT",4);
                iVar1 = uv_udp_try_send(&client,(uv_buf_t *)&eval_a,1,(sockaddr *)&addr);
                eval_b = 4;
                eval_b_6 = (int64_t)iVar1;
                if (eval_b_6 == 4) {
                  puVar2 = uv_default_loop();
                  uv_run(puVar2,UV_RUN_DEFAULT);
                  eval_b = 2;
                  eval_b_6 = (int64_t)close_cb_called;
                  if (eval_b_6 == 2) {
                    eval_b = 1;
                    eval_b_6 = (int64_t)sv_recv_cb_called;
                    if (eval_b_6 == 1) {
                      eval_b_6 = 0;
                      if (client.send_queue_size == 0) {
                        eval_b_6 = 0;
                        if (server.send_queue_size == 0) {
                          puVar2 = uv_default_loop();
                          uv_walk(puVar2,close_walk_cb,(void *)0x0);
                          uv_run(puVar2,UV_RUN_DEFAULT);
                          eval_b = 0;
                          puVar2 = uv_default_loop();
                          iVar1 = uv_loop_close(puVar2);
                          eval_b_6 = (int64_t)iVar1;
                          if (eval_b_6 == 0) {
                            uv_library_shutdown();
                            return 0;
                          }
                          pcVar4 = "uv_loop_close(uv_default_loop())";
                          pcVar3 = "0";
                          uVar5 = 0x77;
                        }
                        else {
                          pcVar4 = "0";
                          pcVar3 = "server.send_queue_size";
                          uVar5 = 0x75;
                          eval_b = server.send_queue_size;
                        }
                      }
                      else {
                        pcVar4 = "0";
                        pcVar3 = "client.send_queue_size";
                        uVar5 = 0x74;
                        eval_b = client.send_queue_size;
                      }
                    }
                    else {
                      pcVar4 = "sv_recv_cb_called";
                      pcVar3 = "1";
                      uVar5 = 0x72;
                    }
                  }
                  else {
                    pcVar4 = "close_cb_called";
                    pcVar3 = "2";
                    uVar5 = 0x71;
                  }
                }
                else {
                  pcVar4 = "r";
                  pcVar3 = "4";
                  uVar5 = 0x6d;
                }
              }
              else {
                pcVar4 = "UV_EMSGSIZE";
                pcVar3 = "r";
                uVar5 = 0x69;
              }
              goto LAB_001ac7e0;
            }
            pcVar3 = "r";
            uVar5 = 0x65;
          }
          else {
            pcVar3 = "uv_ip4_addr(\"127.0.0.1\", 9123, &addr)";
            uVar5 = 0x62;
          }
        }
        else {
          pcVar3 = "r";
          uVar5 = 0x60;
        }
      }
      else {
        pcVar3 = "r";
        uVar5 = 0x5d;
      }
    }
    else {
      pcVar3 = "r";
      uVar5 = 0x5a;
    }
  }
  else {
    pcVar3 = "uv_ip4_addr(\"0.0.0.0\", 9123, &addr)";
    uVar5 = 0x57;
  }
  pcVar4 = "0";
  eval_b_6 = 0;
  eval_b = eval_a;
LAB_001ac7e0:
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-udp-try-send.c"
          ,uVar5,pcVar3,"==",pcVar4,eval_b,"==",eval_b_6);
  abort();
}

Assistant:

TEST_IMPL(udp_try_send) {
  struct sockaddr_in addr;
  static char buffer[64 * 1024];
  uv_buf_t buf;
  int r;

  ASSERT_OK(uv_ip4_addr("0.0.0.0", TEST_PORT, &addr));

  r = uv_udp_init(uv_default_loop(), &server);
  ASSERT_OK(r);

  r = uv_udp_bind(&server, (const struct sockaddr*) &addr, 0);
  ASSERT_OK(r);

  r = uv_udp_recv_start(&server, alloc_cb, sv_recv_cb);
  ASSERT_OK(r);

  ASSERT_OK(uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));

  r = uv_udp_init(uv_default_loop(), &client);
  ASSERT_OK(r);

  buf = uv_buf_init(buffer, sizeof(buffer));
  r = uv_udp_try_send(&client, &buf, 1, (const struct sockaddr*) &addr);
  ASSERT_EQ(r, UV_EMSGSIZE);

  buf = uv_buf_init("EXIT", 4);
  r = uv_udp_try_send(&client, &buf, 1, (const struct sockaddr*) &addr);
  ASSERT_EQ(4, r);

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT_EQ(2, close_cb_called);
  ASSERT_EQ(1, sv_recv_cb_called);

  ASSERT_OK(client.send_queue_size);
  ASSERT_OK(server.send_queue_size);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}